

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

Diagnostics * __thiscall slang::ast::Compilation::getParseDiagnostics(Compilation *this)

{
  bool bVar1;
  element_type *this_00;
  SourceManager *in_RDI;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *__range2;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *in_stack_ffffffffffffffb8;
  optional<slang::Diagnostics> *in_stack_ffffffffffffffc0;
  SmallVectorBase<slang::Diagnostic> *in_stack_ffffffffffffffd0;
  __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
  local_20;
  pointer *local_18;
  Diagnostics *local_8;
  
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::Diagnostics> *)0x53d38f);
  if (bVar1) {
    local_8 = std::optional<slang::Diagnostics>::operator*((optional<slang::Diagnostics> *)0x53d3a6)
    ;
  }
  else {
    std::optional<slang::Diagnostics>::emplace<>(in_stack_ffffffffffffffc0);
    local_18 = &in_RDI[6].userDirectories.
                super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_20._M_current =
         (shared_ptr<slang::syntax::SyntaxTree> *)
         std::
         vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    std::
    vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
    ::end(in_stack_ffffffffffffffb8);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                        ((__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                          *)in_stack_ffffffffffffffc0,
                         (__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                          *)in_stack_ffffffffffffffb8);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_ffffffffffffffd0 =
           (SmallVectorBase<slang::Diagnostic> *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
           ::operator*(&local_20);
      in_stack_ffffffffffffffc0 =
           (optional<slang::Diagnostics> *)
           std::optional<slang::Diagnostics>::operator->((optional<slang::Diagnostics> *)0x53d42a);
      this_00 = std::
                __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x53d439);
      slang::syntax::SyntaxTree::diagnostics(this_00);
      SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
                (in_stack_ffffffffffffffd0,(Diagnostics *)in_RDI);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
      ::operator++(&local_20);
    }
    if (in_RDI[3].userDirectories.
        super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::optional<slang::Diagnostics>::operator->((optional<slang::Diagnostics> *)0x53d47a);
      Diagnostics::sort((Diagnostics *)in_stack_ffffffffffffffd0,in_RDI);
    }
    local_8 = std::optional<slang::Diagnostics>::operator*((optional<slang::Diagnostics> *)0x53d49f)
    ;
  }
  return local_8;
}

Assistant:

const Diagnostics& Compilation::getParseDiagnostics() {
    if (cachedParseDiagnostics)
        return *cachedParseDiagnostics;

    SLANG_ASSERT(!isFrozen());

    cachedParseDiagnostics.emplace();
    for (auto& tree : syntaxTrees)
        cachedParseDiagnostics->append_range(tree->diagnostics());

    if (sourceManager)
        cachedParseDiagnostics->sort(*sourceManager);
    return *cachedParseDiagnostics;
}